

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

iterator __thiscall QList<const_QWidget_*>::end(QList<const_QWidget_*> *this)

{
  QWidget **n;
  QArrayDataPointer<const_QWidget_*> *in_RDI;
  long in_FS_OFFSET;
  QArrayDataPointer<const_QWidget_*> *in_stack_ffffffffffffffe0;
  iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  detach((QList<const_QWidget_*> *)0x4d7e89);
  QArrayDataPointer<const_QWidget_*>::operator->(in_RDI);
  n = QArrayDataPointer<const_QWidget_*>::end(in_stack_ffffffffffffffe0);
  iterator::iterator(&local_10,n);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (iterator)local_10.i;
  }
  __stack_chk_fail();
}

Assistant:

iterator end() { detach(); return iterator(d->end()); }